

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall ON_SimpleArray<void_*>::Append(ON_SimpleArray<void_*> *this,void **x)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  void **memblock;
  long lVar4;
  uint uVar5;
  
  uVar3 = *(uint *)(this + 0x10);
  lVar4 = (long)(int)uVar3;
  if (uVar3 == *(uint *)(this + 0x14)) {
    if ((int)uVar3 < 8 || (ulong)(lVar4 * 8) < 0x10000001) {
      uVar5 = 4;
      if (2 < (int)uVar3) {
        uVar5 = uVar3 * 2;
      }
    }
    else {
      uVar5 = 0x2000008;
      if (uVar3 < 0x2000008) {
        uVar5 = uVar3;
      }
      uVar5 = uVar5 + uVar3;
    }
    memblock = x;
    if (x < *(void ***)(this + 8) + lVar4 && *(void ***)(this + 8) <= x) {
      memblock = (void **)onmalloc(8);
      *memblock = *x;
      uVar3 = *(uint *)(this + 0x14);
    }
    if (uVar3 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
    if (*(long *)(this + 8) == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar1 = *(int *)(this + 0x10);
    pvVar2 = *memblock;
    *(int *)(this + 0x10) = iVar1 + 1;
    *(void **)(*(long *)(this + 8) + (long)iVar1 * 8) = pvVar2;
    if (memblock != x) {
      onfree(memblock);
      return;
    }
  }
  else {
    pvVar2 = *x;
    *(uint *)(this + 0x10) = uVar3 + 1;
    *(void **)(*(long *)(this + 8) + lVar4 * 8) = pvVar2;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}